

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

void joypad_init_file_data(JoypadBuffer *buffer,FileData *file_data)

{
  JoypadChunk *pJVar1;
  u8 *puVar2;
  JoypadBuffer *pJVar3;
  size_t __size;
  
  pJVar3 = (JoypadBuffer *)(buffer->sentinel).next;
  if (pJVar3 == buffer) {
    __size = 0;
  }
  else {
    __size = 0;
    do {
      pJVar1 = &pJVar3->sentinel;
      pJVar3 = (JoypadBuffer *)(pJVar3->sentinel).next;
      __size = __size + pJVar1->size * 0x10;
    } while (pJVar3 != buffer);
  }
  file_data->size = __size;
  puVar2 = (u8 *)malloc(__size);
  file_data->data = puVar2;
  return;
}

Assistant:

void joypad_init_file_data(JoypadBuffer* buffer, FileData* file_data) {
  file_data->size = joypad_file_size(buffer);
  file_data->data = xmalloc(file_data->size);
}